

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.cpp
# Opt level: O1

string_t __thiscall
duckdb::NumericHelper::FormatSigned<duckdb::hugeint_t>
          (NumericHelper *this,hugeint_t value,Vector *vector)

{
  int iVar1;
  Vector *vector_00;
  char *pcVar2;
  ulong uVar3;
  OutOfRangeException *this_00;
  idx_t len;
  undefined1 *puVar4;
  ulong uVar5;
  uint val;
  hugeint_t value_00;
  anon_struct_16_3_d7536bce_for_pointer aVar6;
  hugeint_t value_01;
  string_t result;
  undefined1 local_60 [16];
  string local_50;
  
  value_01.upper = (Vector *)value.upper;
  uVar5 = value.lower;
  uVar3 = uVar5;
  if ((long)uVar5 < 0) {
    if (uVar5 == 0x8000000000000000 && this == (NumericHelper *)0x0) {
      aVar6 = (anon_struct_16_3_d7536bce_for_pointer)
              StringVector::AddString(value_01.upper,"-170141183460469231731687303715884105728");
      return (string_t)aVar6;
    }
    if (uVar5 == 0x8000000000000000 && this == (NumericHelper *)0x0) {
      this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Negation of HUGEINT is out of range!","");
      OutOfRangeException::OutOfRangeException(this_00,&local_50);
      __cxa_throw(this_00,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar3 = ~uVar5 + (ulong)(this == (NumericHelper *)0x0);
    this = (NumericHelper *)-(long)this;
  }
  value_01.lower = uVar3;
  iVar1 = UnsignedLength<duckdb::hugeint_t>(this,value_01);
  val = iVar1 - (value.lower._4_4_ >> 0x1f);
  vector_00 = (Vector *)NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  local_60 = (undefined1  [16])
             StringVector::EmptyString((StringVector *)value_01.upper,vector_00,len);
  puVar4 = local_60._8_8_;
  if (local_60._0_4_ < 0xd) {
    puVar4 = local_60 + 4;
  }
  if (uVar3 == 0) {
    pcVar2 = FormatUnsigned<unsigned_long>((unsigned_long)this,puVar4 + val);
  }
  else {
    value_00.upper = uVar3;
    value_00.lower = (uint64_t)this;
    pcVar2 = FormatUnsigned<duckdb::hugeint_t>(value_00,puVar4 + val);
  }
  if ((long)uVar5 < 0) {
    pcVar2[-1] = '-';
  }
  uVar3 = (ulong)(uint)local_60._0_4_;
  if (uVar3 < 0xd) {
    switchD_005700f1::default(local_60 + 4 + uVar3,0,0xc - uVar3);
  }
  else {
    local_60._4_4_ = *(undefined4 *)local_60._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_60;
}

Assistant:

string_t NumericHelper::FormatSigned(hugeint_t value, Vector &vector) {
	int negative = value.upper < 0;
	if (negative) {
		if (value == NumericLimits<hugeint_t>::Minimum()) {
			string_t result = StringVector::AddString(vector, Hugeint::HUGEINT_MINIMUM_STRING);
			return result;
		}
		Hugeint::NegateInPlace(value);
	}
	int length = UnsignedLength(value) + negative;
	string_t result = StringVector::EmptyString(vector, NumericCast<size_t>(length));
	auto dataptr = result.GetDataWriteable();
	auto endptr = dataptr + length;
	if (value.upper == 0) {
		// small value: format as uint64_t
		endptr = NumericHelper::FormatUnsigned<uint64_t>(value.lower, endptr);
	} else {
		endptr = FormatUnsigned(value, endptr);
	}
	if (negative) {
		*--endptr = '-';
	}
	D_ASSERT(endptr == dataptr);
	result.Finalize();
	return result;
}